

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubDExpandEdgesParameters::Hash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDExpandEdgesParameters *this)

{
  Style SVar1;
  uint i;
  double x;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_b4;
  double local_b0 [2];
  double local_a0 [2];
  undefined1 local_90 [8];
  ON_SHA1 sha1;
  ON_SubDExpandEdgesParameters *this_local;
  
  sha1.m_sha1_hash.m_digest._12_8_ = this;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_90);
  x = ConstantOffset(this);
  ON_SHA1::AccumulateDouble((ON_SHA1 *)local_90,x);
  local_a0 = (double  [2])VariableOffset(this);
  ON_SHA1::AccumulateDouble((ON_SHA1 *)local_90,local_a0[0]);
  local_b0 = (double  [2])VariableOffset(this);
  ON_SHA1::AccumulateDouble((ON_SHA1 *)local_90,local_b0[1]);
  local_b4 = (anon_union_4_2_6147a14e_for_ON_Color_15)FaceColor(this);
  i = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_b4);
  ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_90,i);
  ON_SHA1::AccumulateBytes((ON_SHA1 *)local_90,&this->m_face_status,2);
  SVar1 = FaceStyle(this);
  ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_90,(uint)SVar1);
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_90);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDExpandEdgesParameters::Hash() const
{
  ON_SHA1 sha1;
  sha1.AccumulateDouble(ConstantOffset());
  sha1.AccumulateDouble(VariableOffset().m_t[0]);
  sha1.AccumulateDouble(VariableOffset().m_t[1]);
  sha1.AccumulateInteger32((unsigned int)FaceColor());
  sha1.AccumulateBytes(&m_face_status, sizeof(m_face_status));
  sha1.AccumulateInteger32((unsigned int)FaceStyle());
  return sha1.Hash();
}